

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription
          (SubpassDescription *this,VkSubpassDescription *rhs)

{
  uint uVar1;
  VkAttachmentReference *pVVar2;
  uint *__first;
  VkAttachmentReference *pVVar3;
  VkAttachmentReference *pVVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  VkSubpassDescriptionFlags VVar9;
  VkPipelineBindPoint VVar10;
  deUint32 dVar11;
  undefined4 uVar12;
  bool bVar13;
  reference pvVar14;
  reference pvVar15;
  allocator<unsigned_int> local_a1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  allocator<vk::VkAttachmentReference> local_81;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_80;
  allocator<vk::VkAttachmentReference> local_61;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_60;
  allocator<vk::VkAttachmentReference> local_31;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_30;
  VkSubpassDescription *local_18;
  VkSubpassDescription *rhs_local;
  SubpassDescription *this_local;
  
  local_18 = rhs;
  rhs_local = &this->super_VkSubpassDescription;
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_inputAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_colorAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_resolveAttachments);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_preserveAttachments);
  (this->super_VkSubpassDescription).pPreserveAttachments = local_18->pPreserveAttachments;
  VVar9 = local_18->flags;
  VVar10 = local_18->pipelineBindPoint;
  dVar11 = local_18->inputAttachmentCount;
  uVar12 = *(undefined4 *)&local_18->field_0xc;
  pVVar2 = local_18->pInputAttachments;
  dVar7 = local_18->colorAttachmentCount;
  uVar8 = *(undefined4 *)&local_18->field_0x1c;
  pVVar3 = local_18->pColorAttachments;
  pVVar4 = local_18->pResolveAttachments;
  dVar5 = local_18->preserveAttachmentCount;
  uVar6 = *(undefined4 *)&local_18->field_0x3c;
  (this->super_VkSubpassDescription).pDepthStencilAttachment = local_18->pDepthStencilAttachment;
  (this->super_VkSubpassDescription).preserveAttachmentCount = dVar5;
  *(undefined4 *)&(this->super_VkSubpassDescription).field_0x3c = uVar6;
  (this->super_VkSubpassDescription).pColorAttachments = pVVar3;
  (this->super_VkSubpassDescription).pResolveAttachments = pVVar4;
  (this->super_VkSubpassDescription).pInputAttachments = pVVar2;
  (this->super_VkSubpassDescription).colorAttachmentCount = dVar7;
  *(undefined4 *)&(this->super_VkSubpassDescription).field_0x1c = uVar8;
  (this->super_VkSubpassDescription).flags = VVar9;
  (this->super_VkSubpassDescription).pipelineBindPoint = VVar10;
  (this->super_VkSubpassDescription).inputAttachmentCount = dVar11;
  *(undefined4 *)&(this->super_VkSubpassDescription).field_0xc = uVar12;
  pVVar2 = local_18->pInputAttachments;
  uVar1 = local_18->inputAttachmentCount;
  std::allocator<vk::VkAttachmentReference>::allocator(&local_31);
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_30,pVVar2,pVVar2 + uVar1,&local_31);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_inputAttachments,&local_30);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            (&local_30);
  std::allocator<vk::VkAttachmentReference>::~allocator(&local_31);
  pVVar2 = local_18->pColorAttachments;
  uVar1 = local_18->colorAttachmentCount;
  std::allocator<vk::VkAttachmentReference>::allocator(&local_61);
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_60,pVVar2,pVVar2 + uVar1,&local_61);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_colorAttachments,&local_60);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            (&local_60);
  std::allocator<vk::VkAttachmentReference>::~allocator(&local_61);
  if (local_18->pResolveAttachments != (VkAttachmentReference *)0x0) {
    pVVar2 = local_18->pResolveAttachments;
    uVar1 = local_18->colorAttachmentCount;
    std::allocator<vk::VkAttachmentReference>::allocator(&local_81);
    std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
    vector<vk::VkAttachmentReference_const*,void>
              ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
               &local_80,pVVar2,pVVar2 + uVar1,&local_81);
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
              (&this->m_resolveAttachments,&local_80);
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
              (&local_80);
    std::allocator<vk::VkAttachmentReference>::~allocator(&local_81);
  }
  __first = local_18->pPreserveAttachments;
  uVar1 = local_18->preserveAttachmentCount;
  std::allocator<unsigned_int>::allocator(&local_a1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a0,__first,__first + uVar1,
             &local_a1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->m_preserveAttachments,&local_a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a0);
  std::allocator<unsigned_int>::~allocator(&local_a1);
  if (local_18->pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
    this->m_depthStencilAttachment = *local_18->pDepthStencilAttachment;
  }
  bVar13 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                     (&this->m_inputAttachments);
  if (!bVar13) {
    pvVar14 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
              operator[](&this->m_inputAttachments,0);
    (this->super_VkSubpassDescription).pInputAttachments = pvVar14;
  }
  bVar13 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                     (&this->m_colorAttachments);
  if (!bVar13) {
    pvVar14 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
              operator[](&this->m_colorAttachments,0);
    (this->super_VkSubpassDescription).pColorAttachments = pvVar14;
  }
  bVar13 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                     (&this->m_resolveAttachments);
  if (!bVar13) {
    pvVar14 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
              operator[](&this->m_resolveAttachments,0);
    (this->super_VkSubpassDescription).pResolveAttachments = pvVar14;
  }
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  bVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                     (&this->m_preserveAttachments);
  if (!bVar13) {
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_preserveAttachments,0);
    (this->super_VkSubpassDescription).pPreserveAttachments = pvVar15;
  }
  return;
}

Assistant:

SubpassDescription::SubpassDescription (const vk::VkSubpassDescription& rhs)
{
	*static_cast<vk::VkSubpassDescription*>(this) = rhs;

	m_inputAttachments = std::vector<vk::VkAttachmentReference>(
		rhs.pInputAttachments, rhs.pInputAttachments + rhs.inputAttachmentCount);

	m_colorAttachments = std::vector<vk::VkAttachmentReference>(
		rhs.pColorAttachments, rhs.pColorAttachments + rhs.colorAttachmentCount);

	if (rhs.pResolveAttachments)
		m_resolveAttachments = std::vector<vk::VkAttachmentReference>(
			rhs.pResolveAttachments, rhs.pResolveAttachments + rhs.colorAttachmentCount);

	m_preserveAttachments = std::vector<deUint32>(
		rhs.pPreserveAttachments, rhs.pPreserveAttachments + rhs.preserveAttachmentCount);

	if (rhs.pDepthStencilAttachment)
		m_depthStencilAttachment = *rhs.pDepthStencilAttachment;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	pDepthStencilAttachment = &m_depthStencilAttachment;

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];
}